

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock.h
# Opt level: O2

void __thiscall
testing::internal::FunctionMockerBase<test_result_(bool)>::FunctionMockerBase
          (FunctionMockerBase<test_result_(bool)> *this)

{
  UntypedFunctionMockerBase::UntypedFunctionMockerBase(&this->super_UntypedFunctionMockerBase);
  (this->super_UntypedFunctionMockerBase)._vptr_UntypedFunctionMockerBase =
       (_func_int **)&PTR__FunctionMockerBase_001b77e8;
  (this->current_spec_).function_mocker_ = this;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<bool>.impl_.value_ =
       (MatcherInterface<bool> *)0x0;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<bool>.impl_.link_.next_ =
       &(this->current_spec_).matchers_.f0_.super_MatcherBase<bool>.impl_.link_;
  (this->current_spec_).matchers_.f0_.super_MatcherBase<bool>._vptr_MatcherBase =
       (_func_int **)&PTR__MatcherBase_001b7838;
  return;
}

Assistant:

FunctionMockerBase() : current_spec_(this) {}